

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O1

bool __thiscall gui::MultilineTextBox::handleKeyPressed(MultilineTextBox *this,KeyEvent *key)

{
  Vector2<unsigned_long> *pVVar1;
  Key KVar2;
  pointer pSVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  Uint32 UVar8;
  size_t sVar9;
  Iterator IVar10;
  Iterator IVar11;
  size_t sVar12;
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar13;
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar14;
  int delta;
  Vector2<unsigned_long> *pVVar15;
  Vector2<unsigned_long> *pVVar16;
  undefined1 continueSelection;
  uint32_t unicode;
  byte bVar17;
  String *x_2;
  unsigned_long uVar18;
  long lVar19;
  String *this_00;
  pointer pSVar20;
  String *x_1;
  String *x;
  ulong uVar21;
  anon_class_8_1_8991fb9c getSelectedText;
  String local_78;
  String *local_50;
  anon_class_8_1_8991fb9c local_48;
  Vector2<unsigned_long> local_40;
  
  pVVar15 = (Vector2<unsigned_long> *)&local_78;
  pVVar16 = (Vector2<unsigned_long> *)&local_78;
  bVar6 = Widget::handleKeyPressed(&this->super_Widget,key);
  sVar9 = findCaretOffset(this,&this->caretPosition_);
  KVar2 = key->code;
  local_48.this = this;
  if (key->control == true) {
    if (W < KVar2) {
      switch(KVar2) {
      case Left:
        uVar18 = (this->caretPosition_).x;
        if (uVar18 != 0) {
          local_50 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>
                     ._M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
          sVar9 = uVar18 - 1;
          if (sVar9 == 0) {
            bVar6 = true;
          }
          else {
            bVar6 = false;
            do {
              UVar8 = sf::String::operator[](local_50,sVar9);
              bVar7 = true;
              if ((UVar8 == 0x20) && (bVar7 = bVar6, bVar6)) {
                uVar18 = sVar9 + 1;
                goto LAB_00194c05;
              }
              bVar6 = bVar7;
              sVar9 = sVar9 - 1;
            } while (sVar9 != 0);
            uVar18 = 1;
            sVar9 = 0;
LAB_00194c05:
            bVar6 = (bool)(bVar6 ^ 1);
          }
          UVar8 = sf::String::operator[](local_50,sVar9);
          if (bVar6) {
            uVar18 = sVar9;
          }
          local_40.x = uVar18;
          if (UVar8 != 0x20) {
            local_40.x = sVar9;
          }
          local_40.y = (this->caretPosition_).y;
          sVar9 = findCaretOffset(this,&local_40);
          bVar6 = key->shift;
          local_78.m_string._0_16_ = findCaretPosition(this,sVar9);
          updateCaretPosition(this,(Vector2<unsigned_long> *)&local_78,bVar6);
          return true;
        }
        if (sVar9 == 0) {
          return true;
        }
        sVar9 = sVar9 - 1;
LAB_00194b67:
        updateCaretPosition(this,sVar9,key->shift);
        return true;
      case Right:
        uVar21 = (this->caretPosition_).x;
        sVar12 = sf::String::getSize((this->boxStrings_).
                                     super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                     _M_impl.super__Vector_impl_data._M_start +
                                     (this->caretPosition_).y);
        if (sVar12 <= uVar21) {
          pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          lVar19 = 0;
          for (pSVar20 = (this->boxStrings_).
                         super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                         super__Vector_impl_data._M_start; pSVar20 != pSVar3; pSVar20 = pSVar20 + 1)
          {
            sVar12 = sf::String::getSize(pSVar20);
            lVar19 = lVar19 + sVar12 + 1;
          }
          uVar21 = 0;
          if (lVar19 != 0) {
            uVar21 = lVar19 - 1;
          }
          if (uVar21 <= sVar9) {
            return true;
          }
          sVar9 = sVar9 + 1;
          goto LAB_00194b67;
        }
        uVar21 = (this->caretPosition_).x;
        this_00 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                  _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
        sVar9 = sf::String::getSize(this_00);
        if (uVar21 < sVar9) {
          bVar6 = false;
          do {
            UVar8 = sf::String::operator[](this_00,uVar21);
            bVar7 = true;
            if ((UVar8 != 0x20) && (bVar7 = bVar6, bVar6)) break;
            bVar6 = bVar7;
            uVar21 = uVar21 + 1;
            sVar9 = sf::String::getSize(this_00);
          } while (uVar21 < sVar9);
        }
        local_40.y = (this->caretPosition_).y;
        local_40.x = uVar21;
        goto LAB_00194919;
      case Up:
        bVar6 = key->shift;
        delta = 1;
        break;
      case Down:
        bVar6 = key->shift;
        delta = -1;
        break;
      default:
        if (KVar2 != X) {
          return bVar6;
        }
        if ((this->selectionStart_).second != true) {
          return true;
        }
        handleKeyPressed::anon_class_8_1_8991fb9c::operator()(&local_78,&local_48);
        sf::Clipboard::setString(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)local_78.m_string._M_dataplus._M_p != &local_78.m_string.field_2) {
          operator_delete(local_78.m_string._M_dataplus._M_p);
        }
        insertCharacter(this,8,false);
        return true;
      }
      updateScroll(this,true,delta,bVar6);
      goto LAB_00194b88;
    }
    if (KVar2 != A) {
      if (KVar2 == C) {
        if ((this->selectionStart_).second != true) {
          return true;
        }
        handleKeyPressed::anon_class_8_1_8991fb9c::operator()(&local_78,&local_48);
        sf::Clipboard::setString(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)local_78.m_string._M_dataplus._M_p == &local_78.m_string.field_2) {
          return true;
        }
        operator_delete(local_78.m_string._M_dataplus._M_p);
        return true;
      }
      if (KVar2 != V) {
        return bVar6;
      }
      sf::Clipboard::getString();
      IVar10 = sf::String::begin_abi_cxx11_(&local_78);
      IVar11 = sf::String::end_abi_cxx11_(&local_78);
      bVar17 = 0;
      for (; IVar10._M_current != IVar11._M_current; IVar10._M_current = IVar10._M_current + 1) {
        bVar6 = insertCharacter(this,*IVar10._M_current,true);
        bVar17 = bVar17 | bVar6;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_78.m_string._M_dataplus._M_p != &local_78.m_string.field_2) {
        operator_delete(local_78.m_string._M_dataplus._M_p);
      }
      if (bVar17 == 0) {
        return true;
      }
      pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar19 = 0;
      for (pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar20 != pSVar3;
          pSVar20 = pSVar20 + 1) {
        sVar9 = sf::String::getSize(pSVar20);
        lVar19 = lVar19 + sVar9 + 1;
      }
      uVar18 = 0;
      if (lVar19 != 0) {
        uVar18 = lVar19 - 1;
      }
      Signal<gui::Widget_*,_unsigned_long>::emit(&this->onTextChange,&this->super_Widget,uVar18);
      return true;
    }
    lVar19 = 0;
    local_78.m_string._0_16_ = findCaretPosition(this,0);
    updateCaretPosition(this,(Vector2<unsigned_long> *)&local_78,false);
    pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (pSVar20 != pSVar3) {
      lVar19 = 0;
      do {
        sVar9 = sf::String::getSize(pSVar20);
        lVar19 = lVar19 + sVar9 + 1;
        pSVar20 = pSVar20 + 1;
      } while (pSVar20 != pSVar3);
    }
    sVar9 = 0;
    if (lVar19 != 0) {
      sVar9 = lVar19 - 1;
    }
    local_78.m_string._0_16_ = findCaretPosition(this,sVar9);
    continueSelection = true;
    pVVar16 = (Vector2<unsigned_long> *)&local_78;
    goto LAB_00194a58;
  }
  switch(KVar2) {
  case Enter:
    if (this->maxLines_ == 1) {
      return bVar6;
    }
    bVar7 = insertCharacter(this,10,false);
    if (!bVar7) {
      return bVar6;
    }
    break;
  case BackSpace:
    unicode = 8;
    goto LAB_001949f0;
  case Tab:
    if (this->tabPolicy_ == ignoreTab) {
      return bVar6;
    }
    unicode = 9;
    goto LAB_001949f0;
  case PageUp:
    continueSelection = key->shift;
    sVar9 = 0;
    goto LAB_00194a44;
  case PageDown:
    pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    lVar19 = 0;
    for (pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar20 != pSVar3;
        pSVar20 = pSVar20 + 1) {
      sVar9 = sf::String::getSize(pSVar20);
      lVar19 = lVar19 + sVar9 + 1;
    }
    sVar9 = 0;
    if (lVar19 != 0) {
      sVar9 = lVar19 - 1;
    }
    continueSelection = key->shift;
    goto LAB_00194a44;
  case End:
    local_78.m_string._M_dataplus._M_p =
         (pointer)sf::String::getSize((this->boxStrings_).
                                      super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                                      (this->caretPosition_).y);
    local_78.m_string._M_string_length = (this->caretPosition_).y;
    goto LAB_001949de;
  case Home:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->caretPosition_).y;
    local_78.m_string._0_16_ = auVar5 << 0x40;
LAB_001949de:
    continueSelection = key->shift;
    goto LAB_00194a58;
  default:
    goto switchD_0019461a_caseD_41;
  case Delete:
    unicode = 0x7f;
LAB_001949f0:
    insertCharacter(this,unicode,false);
    break;
  case Left:
    if (((this->selectionStart_).second == true) && (key->shift == false)) {
      pVVar16 = &(this->selectionStart_).first;
      pVVar1 = &this->selectionEnd_;
      uVar21 = (this->selectionEnd_).y;
      uVar4 = (this->selectionStart_).first.y;
      ppVar14 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar1;
      if ((uVar21 <= uVar4) &&
         ((uVar4 != uVar21 ||
          (pVVar1->x <= (((pair<sf::Vector2<unsigned_long>,_bool> *)pVVar16)->first).x)))) {
        ppVar14 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar16;
        pVVar16 = pVVar1;
      }
      local_78.m_string._0_16_ = *pVVar16;
      local_78.m_string.field_2._M_allocated_capacity = (ppVar14->first).x;
      local_78.m_string.field_2._8_8_ = (ppVar14->first).y;
LAB_00194cb0:
      continueSelection = false;
      pVVar16 = pVVar15;
      goto LAB_00194a58;
    }
    if (sVar9 != 0) {
      sVar9 = sVar9 - 1;
LAB_00194af2:
      bVar6 = key->shift;
      goto LAB_00194b83;
    }
    break;
  case Right:
    if (((this->selectionStart_).second == true) && (key->shift == false)) {
      ppVar14 = &this->selectionStart_;
      pVVar15 = &this->selectionEnd_;
      uVar21 = (this->selectionEnd_).y;
      uVar4 = (this->selectionStart_).first.y;
      if ((uVar4 < uVar21) ||
         ((ppVar13 = ppVar14, uVar4 == uVar21 && ((ppVar14->first).x < pVVar15->x)))) {
        ppVar13 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar15;
        pVVar15 = &ppVar14->first;
      }
      local_78.m_string._0_16_ = *pVVar15;
      pVVar15 = (Vector2<unsigned_long> *)&local_78.m_string.field_2;
      local_78.m_string.field_2._M_allocated_capacity = (ppVar13->first).x;
      local_78.m_string.field_2._8_8_ = (ppVar13->first).y;
      goto LAB_00194cb0;
    }
    pSVar3 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    lVar19 = 0;
    for (pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar20 != pSVar3;
        pSVar20 = pSVar20 + 1) {
      sVar12 = sf::String::getSize(pSVar20);
      lVar19 = lVar19 + sVar12 + 1;
    }
    uVar21 = 0;
    if (lVar19 != 0) {
      uVar21 = lVar19 - 1;
    }
    if (sVar9 < uVar21) {
      sVar9 = sVar9 + 1;
      goto LAB_00194af2;
    }
    break;
  case Up:
    local_40.y = (this->caretPosition_).y;
    if (local_40.y == 0) {
      bVar6 = key->shift;
      sVar9 = 0;
      goto LAB_00194b83;
    }
    local_40.x = (this->caretPosition_).x;
    local_40.y = local_40.y - 1;
LAB_00194919:
    sVar9 = findCaretOffset(this,&local_40);
    continueSelection = key->shift;
LAB_00194a44:
    local_78.m_string._0_16_ = findCaretPosition(this,sVar9);
    pVVar16 = (Vector2<unsigned_long> *)&local_78;
LAB_00194a58:
    updateCaretPosition(this,pVVar16,(bool)continueSelection);
    break;
  case Down:
    uVar21 = (this->caretPosition_).y;
    if (uVar21 < ((long)(this->boxStrings_).
                        super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->boxStrings_).
                        super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5) - 1U) {
      local_78.m_string._M_string_length = uVar21 + 1;
      local_78.m_string._M_dataplus._M_p = (pointer)(this->caretPosition_).x;
      sVar9 = findCaretOffset(this,(Vector2<unsigned_long> *)&local_78);
    }
    else {
      sVar9 = anon_unknown.dwarf_4523c8::findStringsLength(&this->boxStrings_);
    }
    bVar6 = key->shift;
LAB_00194b83:
    updateCaretPosition(this,sVar9,bVar6);
  }
LAB_00194b88:
  bVar6 = true;
switchD_0019461a_caseD_41:
  return bVar6;
}

Assistant:

bool MultilineTextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    size_t caretOffset = findCaretOffset(caretPosition_);

    auto getSelectedText = [this]() -> sf::String {
        sf::String selectedText = "";
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    selectedText += boxStrings_[y].substring(selection.first.x, selection.second.x - selection.first.x);
                } else {
                    selectedText += boxStrings_[y].substring(selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                selectedText += "\n" + boxStrings_[y];
            } else if (y == selection.second.y) {
                selectedText += "\n" + boxStrings_[y].substring(0, selection.second.x);
            }
        }
        GUI_DEBUG << "selectedText = [" << selectedText.toAnsiString() << "]\n";
        return selectedText;
    };

    if (key.control) {
        if (key.code == sf::Keyboard::Up) {
            updateScroll(true, 1, key.shift);
        } else if (key.code == sf::Keyboard::Down) {
            updateScroll(true, -1, key.shift);
        } else if (key.code == sf::Keyboard::Left) {
            if (caretPosition_.x > 0) {
                bool foundNonSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x - 1;
                while (i > 0) {
                    if (line[i] != ' ') {
                        foundNonSpace = true;
                    } else if (foundNonSpace) {
                        break;
                    }
                    --i;
                }
                updateCaretPosition(findCaretOffset({(line[i] == ' ' && foundNonSpace ? i + 1 : i), caretPosition_.y}), key.shift);
            } else if (caretOffset > 0) {
                updateCaretPosition(caretOffset - 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::Right) {
            if (caretPosition_.x < boxStrings_[caretPosition_.y].getSize()) {
                bool foundSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x;
                while (i < line.getSize()) {
                    if (line[i] == ' ') {
                        foundSpace = true;
                    } else if (foundSpace) {
                        break;
                    }
                    ++i;
                }
                updateCaretPosition(findCaretOffset({i, caretPosition_.y}), key.shift);
            } else if (caretOffset < findStringsLength(boxStrings_)) {
                updateCaretPosition(caretOffset + 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::A) {
            updateCaretPosition(0, false);
            updateCaretPosition(findStringsLength(boxStrings_), true);
        } else if (key.code == sf::Keyboard::X) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
                insertCharacter('\u0008');
            }
        } else if (key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
            }
        } else if (key.code == sf::Keyboard::V) {
            bool textChanged = false;
            for (auto c : sf::Clipboard::getString()) {
                textChanged = insertCharacter(c, true) || textChanged;
            }
            if (textChanged) {
                onTextChange.emit(this, findStringsLength(boxStrings_));
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::Enter) {
        if (maxLines_ == 1 || !insertCharacter('\u000a')) {
            return eventConsumed;
        }
    } else if (key.code == sf::Keyboard::Backspace) {
        insertCharacter('\u0008');
    } else if (key.code == sf::Keyboard::Tab) {
        if (tabPolicy_ == TabPolicy::ignoreTab) {
            return eventConsumed;
        }
        insertCharacter('\u0009');
    } else if (key.code == sf::Keyboard::Delete) {
        insertCharacter('\u007f');
    } else if (key.code == sf::Keyboard::PageUp) {
        updateCaretPosition(0, key.shift);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateCaretPosition(findStringsLength(boxStrings_), key.shift);
    } else if (key.code == sf::Keyboard::Home) {
        updateCaretPosition({0, caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::End) {
        updateCaretPosition({boxStrings_[caretPosition_.y].getSize(), caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::Up) {
        if (caretPosition_.y > 0) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y - 1}), key.shift);
        } else {
            updateCaretPosition(0, key.shift);
        }
    } else if (key.code == sf::Keyboard::Down) {
        if (caretPosition_.y < boxStrings_.size() - 1) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y + 1}), key.shift);
        } else {
            updateCaretPosition(findStringsLength(boxStrings_), key.shift);
        }
    } else if (key.code == sf::Keyboard::Left) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).first, false);
        } else if (caretOffset > 0) {
            updateCaretPosition(caretOffset - 1, key.shift);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).second, false);
        } else if (caretOffset < findStringsLength(boxStrings_)) {
            updateCaretPosition(caretOffset + 1, key.shift);
        }
    } else {
        return eventConsumed;
    }
    return true;
}